

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O2

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
AddrManImpl::GetAddr_
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,AddrManImpl *this,
          size_t max_addresses,size_t max_pct,optional<Network> network,bool filtered)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Network NVar3;
  ulong uVar4;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> now;
  const_iterator cVar5;
  Logger *pLVar6;
  uint nRndPos1;
  ulong uVar7;
  unsigned_long uVar8;
  AddrInfo *this_00;
  ulong uVar9;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  unsigned_long local_e8 [14];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start >> 2;
  if (max_pct != 0) {
    uVar4 = (uVar4 * max_pct) / 100;
  }
  uVar9 = max_addresses;
  if (uVar4 < max_addresses) {
    uVar9 = uVar4;
  }
  if (max_addresses == 0) {
    uVar9 = uVar4;
  }
  now = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>();
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  nRndPos1 = 0;
  do {
    uVar4 = (ulong)nRndPos1;
    uVar7 = (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    uVar8 = uVar7 - uVar4;
    if ((uVar7 < uVar4 || uVar8 == 0) ||
       (uVar9 <= (ulong)(((long)(__return_storage_ptr__->
                                super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(__return_storage_ptr__->
                               super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                               super__Vector_impl_data._M_start) / 0x38))) {
      bVar2 = ::LogAcceptCategory(ADDRMAN,(Level)uVar8);
      if (bVar2) {
        local_e8[0] = ((long)(__return_storage_ptr__->
                             super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(__return_storage_ptr__->
                            super__Vector_base<CAddress,_std::allocator<CAddress>_>)._M_impl.
                            super__Vector_impl_data._M_start) / 0x38;
        pLVar6 = LogInstance();
        bVar2 = BCLog::Logger::Enabled(pLVar6);
        if (bVar2) {
          log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
          log_msg._M_string_length = 0;
          log_msg.field_2._M_local_buf[0] = '\0';
          tinyformat::format<unsigned_long>
                    (&local_78,"GetAddr returned %d random addresses\n",local_e8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (&log_msg,&local_78);
          std::__cxx11::string::~string((string *)&local_78);
          pLVar6 = LogInstance();
          local_78._M_dataplus._M_p = (pointer)0x54;
          local_78._M_string_length = 0xca13c8;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
          ;
          source_file._M_len = 0x54;
          str._M_str = log_msg._M_dataplus._M_p;
          str._M_len = log_msg._M_string_length;
          logging_function._M_str = "GetAddr_";
          logging_function._M_len = 8;
          BCLog::Logger::LogPrintStr(pLVar6,str,logging_function,source_file,0x348,ADDRMAN,Debug);
          std::__cxx11::string::~string((string *)&log_msg);
        }
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    uVar8 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&(this->insecure_rand).super_RandomMixin<FastRandomContext>,uVar8);
    SwapRandom(this,nRndPos1,(int)uVar8 + nRndPos1);
    cVar5 = std::
            _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&(this->mapInfo)._M_h,
                   (this->vRandom).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar4);
    if (cVar5.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur ==
        (__node_type *)0x0) {
      __assert_fail("it != mapInfo.end()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrman.cpp"
                    ,0x33c,
                    "std::vector<CAddress> AddrManImpl::GetAddr_(size_t, size_t, std::optional<Network>, const bool) const"
                   );
    }
    this_00 = (AddrInfo *)
              ((long)cVar5.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur +
              0x10);
    if (((ulong)network.super__Optional_base<Network,_true,_true>._M_payload.
                super__Optional_payload_base<Network> >> 0x20 & 1) == 0) {
LAB_006a99c7:
      bVar2 = AddrInfo::IsTerrible(this_00,(NodeSeconds)now.__d.__r);
      if (!filtered || !bVar2) {
        std::vector<CAddress,_std::allocator<CAddress>_>::push_back
                  (__return_storage_ptr__,(value_type *)this_00);
      }
    }
    else {
      NVar3 = CNetAddr::GetNetClass((CNetAddr *)this_00);
      if (NVar3 == network.super__Optional_base<Network,_true,_true>._M_payload.
                   super__Optional_payload_base<Network>._M_payload) goto LAB_006a99c7;
    }
    nRndPos1 = nRndPos1 + 1;
  } while( true );
}

Assistant:

std::vector<CAddress> AddrManImpl::GetAddr_(size_t max_addresses, size_t max_pct, std::optional<Network> network, const bool filtered) const
{
    AssertLockHeld(cs);

    size_t nNodes = vRandom.size();
    if (max_pct != 0) {
        nNodes = max_pct * nNodes / 100;
    }
    if (max_addresses != 0) {
        nNodes = std::min(nNodes, max_addresses);
    }

    // gather a list of random nodes, skipping those of low quality
    const auto now{Now<NodeSeconds>()};
    std::vector<CAddress> addresses;
    for (unsigned int n = 0; n < vRandom.size(); n++) {
        if (addresses.size() >= nNodes)
            break;

        int nRndPos = insecure_rand.randrange(vRandom.size() - n) + n;
        SwapRandom(n, nRndPos);
        const auto it{mapInfo.find(vRandom[n])};
        assert(it != mapInfo.end());

        const AddrInfo& ai{it->second};

        // Filter by network (optional)
        if (network != std::nullopt && ai.GetNetClass() != network) continue;

        // Filter for quality
        if (ai.IsTerrible(now) && filtered) continue;

        addresses.push_back(ai);
    }
    LogDebug(BCLog::ADDRMAN, "GetAddr returned %d random addresses\n", addresses.size());
    return addresses;
}